

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O0

bool __thiscall
sf::priv::ImageLoader::saveImageToMemory
          (ImageLoader *this,string *format,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  bool bVar1;
  ostream *poVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  Vector2<unsigned_int> *in_R8;
  Vector2i convertedSize;
  string specified;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar3;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff6c;
  string *this_00;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  int in_stack_ffffffffffffff7c;
  int iVar5;
  int in_stack_ffffffffffffff80;
  int iVar6;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff90;
  string local_50 [32];
  Vector2<unsigned_int> *local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  undefined8 local_20;
  string *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                                      )));
  if (((!bVar1) && (local_30->x != 0)) && (local_30->y != 0)) {
    this_00 = (string *)&stack0xffffffffffffff90;
    std::__cxx11::string::string(this_00,local_18);
    anon_unknown.dwarf_246cd1::toLower
              ((string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    Vector2<int>::Vector2<unsigned_int>((Vector2<int> *)&stack0xffffffffffffff7c,local_30);
    bVar1 = std::operator==(in_stack_ffffffffffffff10,
                            (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
    if (bVar1) {
      iVar5 = in_stack_ffffffffffffff7c;
      iVar6 = in_stack_ffffffffffffff80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
      iVar4 = stbi_write_bmp_to_func
                        ((stbi_write_func *)CONCAT44(in_stack_ffffffffffffff84,iVar6),
                         (void *)CONCAT44(iVar5,in_stack_ffffffffffffff78),
                         (int)((ulong)this_00 >> 0x20),(int)this_00,iVar4,
                         (void *)CONCAT44(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c));
      if (iVar4 == 0) goto LAB_002d6e3c;
      local_1 = 1;
      iVar4 = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff10,
                              (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
      if (bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
        iVar4 = stbi_write_tga_to_func
                          ((stbi_write_func *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (int)((ulong)this_00 >> 0x20),(int)this_00,iVar4,
                           (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if (iVar4 != 0) {
          local_1 = 1;
          iVar4 = 1;
          goto LAB_002d6e44;
        }
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff10,
                                (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
        uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
        if (bVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
          iVar4 = stbi_write_png_to_func
                            ((stbi_write_func *)CONCAT44(uVar3,in_stack_ffffffffffffff38),
                             (void *)CONCAT44(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c),
                             (int)((ulong)local_20 >> 0x20),(int)local_20,
                             CONCAT13(in_stack_ffffffffffffff27,
                                      CONCAT12(in_stack_ffffffffffffff26,in_stack_ffffffffffffff24))
                             ,(void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             in_stack_ffffffffffffff50);
          if (iVar4 != 0) {
            local_1 = 1;
            iVar4 = 1;
            goto LAB_002d6e44;
          }
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff10,
                                  (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08));
          if ((bVar1) ||
             (bVar1 = std::operator==(in_stack_ffffffffffffff10,
                                      (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)), bVar1)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
            iVar4 = stbi_write_jpg_to_func
                              ((stbi_write_func *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                               ,(int)((ulong)this_00 >> 0x20),(int)this_00,iVar4,
                               (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,in_stack_ffffffffffffff90);
            if (iVar4 != 0) {
              local_1 = 1;
              iVar4 = 1;
              goto LAB_002d6e44;
            }
          }
        }
      }
LAB_002d6e3c:
      iVar4 = 0;
    }
LAB_002d6e44:
    std::__cxx11::string::~string(local_50);
    if (iVar4 != 0) goto LAB_002d6ea9;
  }
  poVar2 = err();
  poVar2 = std::operator<<(poVar2,"Failed to save image with format \"");
  poVar2 = std::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_1 = 0;
LAB_002d6ea9:
  return (bool)(local_1 & 1);
}

Assistant:

bool ImageLoader::saveImageToMemory(const std::string& format, std::vector<sf::Uint8>& output, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Choose function based on format

        std::string specified = toLower(format);
        const Vector2i convertedSize = Vector2i(size);

        if (specified == "bmp")
        {
            // BMP format
            if (stbi_write_bmp_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "tga")
        {
            // TGA format
            if (stbi_write_tga_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "png")
        {
            // PNG format
            if (stbi_write_png_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (specified == "jpg" || specified == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image with format \"" << format << "\"" << std::endl;
    return false;
}